

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

void __thiscall gdsBOUNDARY::to_str(gdsBOUNDARY *this)

{
  ostream *poVar1;
  pointer piVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GDS BOUNDARY class:",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  layer: ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  xCor:\tyCor:",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  piVar2 = (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar2[uVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      plVar3 = (long *)std::ostream::operator<<
                                 (poVar1,(this->xCor).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar5]);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      uVar5 = (ulong)uVar4;
      piVar2 = (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this->xCor).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void gdsBOUNDARY::to_str()
{
  cout << "GDS BOUNDARY class:" << endl;

  cout << "  layer: " << this->layer << endl;

  cout << "  xCor:\tyCor:" << endl;
  for (unsigned int i = 0; i < this->xCor.size(); i++) {
    cout << this->xCor[i] << "\t" << this->xCor[i] << endl;
  }
}